

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O3

cupdlp_retcode PDHG_Init_Step_Sizes(CUPDLPwork *pdhg)

{
  CUPDLPproblem *pCVar1;
  CUPDLPiterates *pCVar2;
  CUPDLPstepsize *pCVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  cupdlp_float cVar7;
  cupdlp_float b;
  cupdlp_float a;
  cupdlp_float local_58;
  cupdlp_float local_50;
  double local_48;
  undefined8 uStack_40;
  
  pCVar1 = pdhg->problem;
  pCVar2 = pdhg->iterates;
  pCVar3 = pdhg->stepsize;
  if (pCVar3->eLineSearchMethod == PDHG_FIXED_LINESEARCH) {
    PDHG_Power_Method(pdhg,&pCVar3->dPrimalStep);
    local_50 = 0.0;
    local_58 = 0.0;
    cupdlp_twoNormSquared(pdhg,pCVar1->nCols,pCVar1->cost,&local_50);
    cupdlp_twoNormSquared(pdhg,pCVar1->nRows,pCVar1->rhs,&local_58);
    cVar7 = local_58;
    if (local_50 <= local_58) {
      cVar7 = local_50;
    }
    uVar4 = -(ulong)(1e-06 < (double)(~-(ulong)NAN(local_50) & (ulong)cVar7 |
                                     -(ulong)NAN(local_50) & (ulong)local_58));
    pCVar3->dBeta =
         (cupdlp_float)(~uVar4 & 0x3ff0000000000000 | (ulong)(local_50 / local_58) & uVar4);
    dVar5 = pCVar3->dPrimalStep;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    pCVar3->dPrimalStep = 0.8 / dVar5;
    pCVar3->dDualStep = 0.8 / dVar5;
    dVar5 = pCVar3->dBeta;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    dVar6 = pCVar3->dBeta;
    pCVar3->dPrimalStep = pCVar3->dPrimalStep / dVar5;
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    pCVar3->dDualStep = dVar6 * pCVar3->dDualStep;
  }
  else {
    pCVar3->dTheta = 1.0;
    local_50 = 0.0;
    local_58 = 0.0;
    cupdlp_twoNormSquared(pdhg,pCVar1->nCols,pCVar1->cost,&local_50);
    cupdlp_twoNormSquared(pdhg,pCVar1->nRows,pCVar1->rhs,&local_58);
    cVar7 = local_58;
    if (local_50 <= local_58) {
      cVar7 = local_50;
    }
    uVar4 = -(ulong)(1e-06 < (double)(~-(ulong)NAN(local_50) & (ulong)cVar7 |
                                     -(ulong)NAN(local_50) & (ulong)local_58));
    dVar5 = (double)(~uVar4 & 0x3ff0000000000000 | (ulong)(local_50 / local_58) & uVar4);
    pCVar3->dBeta = dVar5;
    local_48 = 1.0 / pCVar1->data->csc_matrix->MatElemNormInf;
    if (dVar5 < 0.0) {
      uStack_40 = 0;
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    pCVar3->dPrimalStep = local_48 / dVar5;
    pCVar3->dDualStep = (local_48 / dVar5) * pCVar3->dBeta;
    pCVar2->dLastRestartBeta = pCVar3->dBeta;
  }
  pCVar2->iLastRestartIter = 0;
  pCVar3->dSumPrimalStep = 0.0;
  pCVar3->dSumDualStep = 0.0;
  return 0;
}

Assistant:

cupdlp_retcode PDHG_Init_Step_Sizes(CUPDLPwork *pdhg) {
  cupdlp_retcode retcode = RETCODE_OK;

  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPiterates *iterates = pdhg->iterates;
  CUPDLPstepsize *stepsize = pdhg->stepsize;

  if (stepsize->eLineSearchMethod == PDHG_FIXED_LINESEARCH) {
    CUPDLP_CALL(PDHG_Power_Method(pdhg, &stepsize->dPrimalStep));
    // PDLP Intial primal weight = norm(cost) / norm(rhs) = sqrt(beta)
    // cupdlp_float a = twoNormSquared(problem->cost, problem->nCols);
    // cupdlp_float b = twoNormSquared(problem->rhs, problem->nRows);
    cupdlp_float a = 0.0;
    cupdlp_float b = 0.0;
    cupdlp_twoNormSquared(pdhg, problem->nCols, problem->cost, &a);
    cupdlp_twoNormSquared(pdhg, problem->nRows, problem->rhs, &b);

    if (fmin(a, b) > 1e-6) {
      stepsize->dBeta = a / b;
    } else {
      stepsize->dBeta = 1.0;
    }

    stepsize->dPrimalStep = 0.8 / sqrt(stepsize->dPrimalStep);
    stepsize->dDualStep = stepsize->dPrimalStep;
    stepsize->dPrimalStep /= sqrt(stepsize->dBeta);
    stepsize->dDualStep *= sqrt(stepsize->dBeta);
  } else {
    stepsize->dTheta = 1.0;

    // PDLP Intial primal weight = norm(cost) / norm(rhs) = sqrt(beta)
    // cupdlp_float a = twoNormSquared(problem->cost, problem->nCols);
    // cupdlp_float b = twoNormSquared(problem->rhs, problem->nRows);
    cupdlp_float a = 0.0;
    cupdlp_float b = 0.0;
    cupdlp_twoNormSquared(pdhg, problem->nCols, problem->cost, &a);
    cupdlp_twoNormSquared(pdhg, problem->nRows, problem->rhs, &b);

    if (fmin(a, b) > 1e-6) {
      stepsize->dBeta = a / b;
    } else {
      stepsize->dBeta = 1.0;
    }
    // infNorm can be avoid by previously calculated infNorm of csc matrix
    stepsize->dPrimalStep =
        // (1.0 / infNorm(problem->data->csc_matrix->colMatElem,
        // problem->data->csc_matrix->nMatElem)) /
        (1.0 / problem->data->csc_matrix->MatElemNormInf) /
        sqrt(stepsize->dBeta);
    stepsize->dDualStep = stepsize->dPrimalStep * stepsize->dBeta;
    iterates->dLastRestartBeta = stepsize->dBeta;
  }

  iterates->iLastRestartIter = 0;
  stepsize->dSumPrimalStep = 0;
  stepsize->dSumDualStep = 0;

exit_cleanup:
  return retcode;
}